

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O0

void __thiscall
t_haxe_generator::generate_haxe_validator(t_haxe_generator *this,ostream *out,t_struct *tstruct)

{
  bool bVar1;
  e_req eVar2;
  uint uVar3;
  ostream *poVar4;
  t_type *ttype;
  reference pptVar5;
  string *psVar6;
  string local_110;
  string local_f0;
  string local_d0;
  t_type *local_b0;
  t_type *type;
  t_field *field;
  t_field **local_98;
  string local_90;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_70;
  t_field **local_68;
  string local_50;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *tstruct_local;
  ostream *out_local;
  t_haxe_generator *this_local;
  
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"public function validate() : Void {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_50);
  poVar4 = std::operator<<(poVar4,"// check for required fields");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  local_68 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_30._M_current = local_68;
  while( true ) {
    local_70._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_70);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    eVar2 = t_field::get_req(*pptVar5);
    if (eVar2 == T_REQUIRED) {
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_30);
      ttype = t_field::get_type(*pptVar5);
      bVar1 = type_can_be_null(this,ttype);
      if (bVar1) {
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"if (");
        pptVar5 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_30);
        psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
        poVar4 = std::operator<<(poVar4,(string *)psVar6);
        poVar4 = std::operator<<(poVar4," == null) {");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,
                                 "  throw new TProtocolException(TProtocolException.UNKNOWN, \"Required field \'"
                                );
        pptVar5 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_30);
        psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
        poVar4 = std::operator<<(poVar4,(string *)psVar6);
        poVar4 = std::operator<<(poVar4,"\' was not present! Struct: \" + toString());");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"}");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
      else {
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"// alas, we cannot check \'");
        pptVar5 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_30);
        psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
        poVar4 = std::operator<<(poVar4,(string *)psVar6);
        poVar4 = std::operator<<(poVar4,"\' because it\'s a primitive.");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_90);
  poVar4 = std::operator<<(poVar4,"// check that fields of type enum have valid values");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  local_98 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_30._M_current = local_98;
  while( true ) {
    field = (t_field *)
            std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                      ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&field);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    type = (t_type *)*pptVar5;
    local_b0 = t_field::get_type((t_field *)type);
    uVar3 = (*(local_b0->super_t_doc)._vptr_t_doc[10])();
    if ((uVar3 & 1) != 0) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"if (");
      generate_isset_check_abi_cxx11_(&local_d0,this,(t_field *)type);
      poVar4 = std::operator<<(poVar4,(string *)&local_d0);
      poVar4 = std::operator<<(poVar4," && !");
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1f])
                (&local_110,this,local_b0);
      get_cap_name(&local_f0,this,&local_110);
      poVar4 = std::operator<<(poVar4,(string *)&local_f0);
      poVar4 = std::operator<<(poVar4,".VALID_VALUES.contains(");
      psVar6 = t_field::get_name_abi_cxx11_((t_field *)type);
      poVar4 = std::operator<<(poVar4,(string *)psVar6);
      poVar4 = std::operator<<(poVar4,")){");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_d0);
      t_generator::indent_up((t_generator *)this);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,
                               "throw new TProtocolException(TProtocolException.UNKNOWN, \"The field \'"
                              );
      psVar6 = t_field::get_name_abi_cxx11_((t_field *)type);
      poVar4 = std::operator<<(poVar4,(string *)psVar6);
      poVar4 = std::operator<<(poVar4,"\' has been assigned the invalid value \" + ");
      psVar6 = t_field::get_name_abi_cxx11_((t_field *)type);
      poVar4 = std::operator<<(poVar4,(string *)psVar6);
      poVar4 = std::operator<<(poVar4,");");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_down((t_generator *)this);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"}");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_haxe_generator::generate_haxe_validator(ostream& out, t_struct* tstruct) {
  indent(out) << "public function validate() : Void {" << endl;
  indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  out << indent() << "// check for required fields" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      if (type_can_be_null((*f_iter)->get_type())) {
        indent(out) << "if (" << (*f_iter)->get_name() << " == null) {" << endl;
        indent(out)
            << "  throw new TProtocolException(TProtocolException.UNKNOWN, \"Required field '"
            << (*f_iter)->get_name() << "' was not present! Struct: \" + toString());" << endl;
        indent(out) << "}" << endl;
      } else {
        indent(out) << "// alas, we cannot check '" << (*f_iter)->get_name()
                    << "' because it's a primitive." << endl;
      }
    }
  }

  // check that fields of type enum have valid values
  out << indent() << "// check that fields of type enum have valid values" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = (*f_iter);
    t_type* type = field->get_type();
    // if field is an enum, check that its value is valid
    if (type->is_enum()) {
      indent(out) << "if (" << generate_isset_check(field) << " && !"
                  << get_cap_name(get_enum_class_name(type)) << ".VALID_VALUES.contains("
                  << field->get_name() << ")){" << endl;
      indent_up();
      indent(out) << "throw new TProtocolException(TProtocolException.UNKNOWN, \"The field '"
                  << field->get_name() << "' has been assigned the invalid value \" + "
                  << field->get_name() << ");" << endl;
      indent_down();
      indent(out) << "}" << endl;
    }
  }

  indent_down();
  indent(out) << "}" << endl << endl;
}